

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall
dg::vr::RelationsAnalyzer::passFunction(RelationsAnalyzer *this,Function *function,bool print)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  VRLocation *target;
  VREdge *op;
  VRCodeGraph *in_RDI;
  bool bVar4;
  bool locationChanged;
  VREdge *edge;
  VRLocation *location;
  LazyDFS it;
  bool changed;
  VRLocation *in_stack_00000118;
  RelationsAnalyzer *in_stack_00000120;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  VRLocation *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  VRLocation *in_stack_ffffffffffffff38;
  RelationsAnalyzer *in_stack_ffffffffffffff40;
  DFSIt<dg::vr::VRCodeGraph::LazyVisit> *in_stack_ffffffffffffff60;
  VRLocation *in_stack_ffffffffffffffa0;
  
  bVar4 = false;
  VRCodeGraph::lazy_dfs_begin
            (in_RDI,(Function *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  while( true ) {
    VRCodeGraph::lazy_dfs_end();
    bVar1 = vr::operator!=((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_ffffffffffffff00,
                           (DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)
                           CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
              ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_ffffffffffffff00);
    if ((bVar1 & 1) == 0) break;
    target = VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator*
                       ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)0x1d31b1);
    uVar3 = VRLocation::predsSize((VRLocation *)0x1d31c0);
    if (uVar3 < 2) {
      uVar3 = VRLocation::predsSize((VRLocation *)0x1d31ea);
      if (uVar3 == 1) {
        op = VRLocation::getPredEdge(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        in_stack_ffffffffffffff00 = op->source;
        std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
                  ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1d3229);
        processOperation(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,target,(VROp *)op);
      }
    }
    else {
      mergeRelations(in_stack_ffffffffffffffa0);
      mergeRelationsByPointedTo(in_stack_00000120,in_stack_00000118);
    }
    bVar2 = ValueRelations::unsetChanged(&target->relations);
    bVar4 = bVar4 != false || bVar2;
    VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::operator++(in_stack_ffffffffffffff60);
  }
  VRCodeGraph::DFSIt<dg::vr::VRCodeGraph::LazyVisit>::~DFSIt
            ((DFSIt<dg::vr::VRCodeGraph::LazyVisit> *)in_stack_ffffffffffffff00);
  return bVar4;
}

Assistant:

bool RelationsAnalyzer::passFunction(const llvm::Function &function,
                                     __attribute__((unused)) bool print) {
    bool changed = false;

    for (auto it = codeGraph.lazy_dfs_begin(function);
         it != codeGraph.lazy_dfs_end(); ++it) {
        VRLocation &location = *it;
#ifndef NDEBUG
        const bool cond = location.id == 91;
        if (print && cond) {
            std::cerr << "LOCATION " << location.id << "\n";
            for (unsigned i = 0; i < location.predsSize(); ++i) {
                std::cerr << "pred" << i << " "
                          << location.getPredEdge(i)->op->toStr() << "\n";
                std::cerr << location.getPredLocation(i)->relations << "\n";
            }
            std::cerr << "before\n" << location.relations << "\n";
            std::cerr << "inside\n";
        }
#endif

        if (location.predsSize() > 1) {
            mergeRelations(location);
            mergeRelationsByPointedTo(location);
        } else if (location.predsSize() == 1) {
            VREdge *edge = location.getPredEdge(0);
            processOperation(edge->source, edge->target, edge->op.get());
        } // else no predecessors => nothing to be passed

        bool locationChanged = location.relations.unsetChanged();
#ifndef NDEBUG
        if (print && cond) {
            std::cerr << "after\n";
            if (locationChanged)
                std::cerr << location.relations;
            // return false;
        }
#endif
        changed |= locationChanged;
    }
    return changed;
}